

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O1

size_t wabt::cat_compute_size<char[7],std::__cxx11::string,char[2],char_const*>
                 (char (*t) [7],
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                 char (*args_1) [2],char **args_2)

{
  size_type sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar2 = strlen(*t);
  sVar1 = args->_M_string_length;
  sVar3 = strlen(*args_1);
  sVar4 = strlen(*args_2);
  return sVar4 + sVar3 + sVar2 + sVar1;
}

Assistant:

size_t cat_compute_size(const T& t, const Ts&... args) {
  return std::string_view(t).size() + cat_compute_size(args...);
}